

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLrelation.c
# Opt level: O2

void RDL_findTransitiveClosure(RDL_URFinfo *uInfo)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  RDL_stack *stack;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  void *pvVar4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint local_74;
  
  stack = RDL_stack_new();
  for (uVar12 = 0; uVar12 < uInfo->nofWeights; uVar12 = uVar12 + 1) {
    uVar11 = (ulong)uInfo->nofProtos[uVar12];
    __ptr = calloc(1,uVar11);
    __ptr_00 = malloc(uVar11 * 8);
    __ptr_01 = malloc(uVar11 * 4);
    __ptr_02 = malloc(uVar11 * 4);
    uVar9 = 0;
    uVar8 = 0;
    for (uVar6 = 0; uVar6 < uVar11; uVar6 = uVar6 + 1) {
      if (*(char *)((long)__ptr + uVar6) == '\0') {
        pvVar4 = malloc(uVar11 << 2);
        *(undefined4 *)((long)__ptr_01 + uVar9 * 4) = 0;
        *(void **)((long)__ptr_00 + uVar9 * 8) = pvVar4;
        *(int *)((long)__ptr_02 + (ulong)uVar8 * 4) = (int)uVar6;
        RDL_stack_push(stack,(void *)((long)__ptr_02 + (ulong)uVar8 * 4));
        uVar8 = uVar8 + 1;
        *(undefined1 *)((long)__ptr + uVar6) = 1;
        local_74 = 0;
        while (iVar3 = RDL_stack_empty(stack), iVar3 == 0) {
          puVar5 = (uint *)RDL_stack_top(stack);
          uVar1 = *puVar5;
          RDL_stack_pop(stack);
          *(uint *)((long)pvVar4 + (ulong)local_74 * 4) = uVar1;
          local_74 = local_74 + 1;
          *(uint *)((long)__ptr_01 + uVar9 * 4) = local_74;
          for (uVar11 = 0; uVar11 < uInfo->nofProtos[uVar12]; uVar11 = uVar11 + 1) {
            if ((*(char *)((long)__ptr + uVar11) == '\0') &&
               (uInfo->URFrel[uVar12][uVar1][uVar11] != '\0')) {
              *(undefined1 *)((long)__ptr + uVar11) = 1;
              *(int *)((long)__ptr_02 + (ulong)uVar8 * 4) = (int)uVar11;
              RDL_stack_push(stack,(void *)((long)__ptr_02 + (ulong)uVar8 * 4));
              uVar8 = uVar8 + 1;
            }
          }
        }
        uVar9 = (ulong)((int)uVar9 + 1);
        uVar11 = (ulong)uInfo->nofProtos[uVar12];
      }
    }
    for (uVar6 = 0; uVar6 != uVar9; uVar6 = uVar6 + 1) {
      uVar11 = (ulong)*(uint *)((long)__ptr_01 + uVar6 * 4);
      uVar10 = 1;
      for (uVar7 = 0; uVar7 != uVar11; uVar7 = uVar7 + 1) {
        iVar3 = (int)uVar10;
        for (; uVar10 < uVar11; uVar10 = uVar10 + 1) {
          lVar2 = *(long *)((long)__ptr_00 + uVar6 * 8);
          uVar8 = *(uint *)(lVar2 + uVar7 * 4);
          uVar1 = *(uint *)(lVar2 + uVar10 * 4);
          uInfo->URFrel[uVar12][uVar8][uVar1] = '\x01';
          uInfo->URFrel[uVar12][uVar1][uVar8] = '\x01';
        }
        uVar10 = (ulong)(iVar3 + 1);
      }
    }
    for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
      free(*(void **)((long)__ptr_00 + uVar6 * 8));
    }
    free(__ptr_00);
    free(__ptr_01);
    free(__ptr);
    free(__ptr_02);
  }
  RDL_stack_delete(stack);
  return;
}

Assistant:

void RDL_findTransitiveClosure(RDL_URFinfo *uInfo)
{
  unsigned i,j,k,l;
  RDL_stack* dfs_stack;
  char* visited;
  unsigned cc_id;
  unsigned **cc;
  unsigned *cc_size;
  unsigned u, v;
  unsigned *elements;
  unsigned next_free_element;
  unsigned *curr_elem;

  dfs_stack = RDL_stack_new();

  for(i = 0; i < uInfo->nofWeights; ++i) {
    visited = malloc(uInfo->nofProtos[i] * sizeof(*visited));
    memset(visited, 0, uInfo->nofProtos[i] * sizeof(*visited));

    cc_id = 0;
    cc = malloc(uInfo->nofProtos[i] * sizeof(*cc));
    cc_size = malloc(uInfo->nofProtos[i] * sizeof(*cc_size));
    elements = malloc(uInfo->nofProtos[i] * sizeof(*elements));
    next_free_element = 0;

    /*
     * perform a DFS search on the URF relations
     * and collect the connected components
     */
    for(j = 0; j < uInfo->nofProtos[i]; ++j) {
      if (!visited[j]) {
        cc[cc_id] = malloc(uInfo->nofProtos[i] * sizeof(**cc));
        cc_size[cc_id] = 0;

        elements[next_free_element] = j;
        RDL_stack_push(dfs_stack, &(elements[next_free_element]));
        ++next_free_element;
        visited[j] = 1;
        while (!RDL_stack_empty(dfs_stack)) {
          curr_elem = RDL_stack_top(dfs_stack);
          k = *curr_elem;
          RDL_stack_pop(dfs_stack);

          /* save the connected components */
          cc[cc_id][cc_size[cc_id]] = k;
          ++cc_size[cc_id];

          for (l = 0; l < uInfo->nofProtos[i]; ++l) {
            if (!visited[l] && uInfo->URFrel[i][k][l]) {
              visited[l] = 1;
              elements[next_free_element] = l;
              RDL_stack_push(dfs_stack, &(elements[next_free_element]));
              ++next_free_element;
            }
          }
        }

        ++cc_id;
      }
    }

    /* every pair inside a CC is URF related */
    for(j = 0; j < cc_id; ++j) {
      for (k = 0; k < cc_size[j]; ++k) {
        for (l = k+1; l < cc_size[j]; ++l) {
          u = cc[j][k];
          v = cc[j][l];
          uInfo->URFrel[i][u][v] = 1;
          uInfo->URFrel[i][v][u] = 1;
        }
      }
    }

    for(j = 0; j < cc_id; ++j) {
      free(cc[j]);
    }
    free(cc);
    free(cc_size);
    free(visited);
    free(elements);
  }

  RDL_stack_delete(dfs_stack);
}